

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pred_tests.cpp
# Opt level: O0

void __thiscall
iu_AssertionTest_x_iutest_x_Pred5_Test::Body(iu_AssertionTest_x_iutest_x_Pred5_Test *this)

{
  bool bVar1;
  char *pcVar2;
  uint in_stack_fffffffffffff7ac;
  int in_stack_fffffffffffff7d0;
  AssertionHelper local_7a8;
  Fixed local_778;
  undefined1 local_5f0 [8];
  AssertionResult iutest_ar_3;
  Fixed local_598;
  undefined1 local_410 [8];
  AssertionResult iutest_ar_2;
  Fixed local_3b8;
  undefined1 local_230 [8];
  AssertionResult iutest_ar_1;
  AssertionHelper local_200;
  Fixed local_1d0;
  undefined1 local_38 [8];
  AssertionResult iutest_ar;
  iu_AssertionTest_x_iutest_x_Pred5_Test *this_local;
  
  iutest_ar._32_8_ = this;
  iutest::detail::AlwaysZero();
  iutest::AssertPred5Helper<bool(*)(int,int,int,int,int),int,int,int,int,int>
            ((AssertionResult *)local_38,(iutest *)"PredTest5","0","1","2","3","4",(char *)PredTest5
             ,(_func_bool_int_int_int_int_int *)((ulong)in_stack_fffffffffffff7ac << 0x20),1,2,3,4,
             in_stack_fffffffffffff7d0);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    memset(&local_1d0,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_1d0);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_38);
    iutest::AssertionHelper::AssertionHelper
              (&local_200,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/pred_tests.cpp"
               ,0x37,pcVar2,kFatalFailure);
    iutest::AssertionHelper::operator=(&local_200,&local_1d0);
    iutest::AssertionHelper::~AssertionHelper(&local_200);
    iutest::AssertionHelper::Fixed::~Fixed(&local_1d0);
  }
  iutest_ar_1._37_3_ = 0;
  iutest_ar_1._36_1_ = !bVar1;
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  if (iutest_ar_1._36_4_ == 0) {
    iutest::detail::AlwaysZero();
    iutest::AssertPred5Helper<bool(*)(int,int,int,int,int),int,int,int,int,int>
              ((AssertionResult *)local_230,(iutest *)"PredTest5","0","1","2","3","4",
               (char *)PredTest5,
               (_func_bool_int_int_int_int_int *)((ulong)in_stack_fffffffffffff7ac << 0x20),1,2,3,4,
               in_stack_fffffffffffff7d0);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_230);
    if (!bVar1) {
      memset(&local_3b8,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_3b8);
      pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_230);
      iutest::AssertionHelper::AssertionHelper
                ((AssertionHelper *)&iutest_ar_2.m_result,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/pred_tests.cpp"
                 ,0x38,pcVar2,kNonFatalFailure);
      iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_2.m_result,&local_3b8);
      iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_2.m_result);
      iutest::AssertionHelper::Fixed::~Fixed(&local_3b8);
    }
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_230);
    iutest::detail::AlwaysZero();
    iutest::AssertPred5Helper<bool(*)(int,int,int,int,int),int,int,int,int,int>
              ((AssertionResult *)local_410,(iutest *)"PredTest5","0","1","2","3","4",
               (char *)PredTest5,
               (_func_bool_int_int_int_int_int *)((ulong)in_stack_fffffffffffff7ac << 0x20),1,2,3,4,
               in_stack_fffffffffffff7d0);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_410);
    if (!bVar1) {
      memset(&local_598,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_598);
      pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_410);
      iutest::AssertionHelper::AssertionHelper
                ((AssertionHelper *)&iutest_ar_3.m_result,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/pred_tests.cpp"
                 ,0x39,pcVar2,kWarning);
      iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_3.m_result,&local_598);
      iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_3.m_result);
      iutest::AssertionHelper::Fixed::~Fixed(&local_598);
    }
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_410);
    iutest::detail::AlwaysZero();
    iutest::AssertPred5Helper<bool(*)(int,int,int,int,int),int,int,int,int,int>
              ((AssertionResult *)local_5f0,(iutest *)"PredTest5","0","1","2","3","4",
               (char *)PredTest5,
               (_func_bool_int_int_int_int_int *)((ulong)in_stack_fffffffffffff7ac << 0x20),1,2,3,4,
               in_stack_fffffffffffff7d0);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5f0);
    if (!bVar1) {
      memset(&local_778,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_778);
      pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_5f0);
      iutest::AssertionHelper::AssertionHelper
                (&local_7a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/pred_tests.cpp"
                 ,0x3a,pcVar2,kAssumeFailure);
      iutest::AssertionHelper::operator=(&local_7a8,&local_778);
      iutest::AssertionHelper::~AssertionHelper(&local_7a8);
      iutest::AssertionHelper::Fixed::~Fixed(&local_778);
    }
    iutest_ar_1._37_3_ = 0;
    iutest_ar_1._36_1_ = !bVar1;
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_5f0);
  }
  return;
}

Assistant:

IUTEST(AssertionTest, Pred5)
{
    IUTEST_ASSERT_PRED5(PredTest5, 0, 1, 2, 3, 4);
    IUTEST_EXPECT_PRED5(PredTest5, 0, 1, 2, 3, 4);
    IUTEST_INFORM_PRED5(PredTest5, 0, 1, 2, 3, 4);
    IUTEST_ASSUME_PRED5(PredTest5, 0, 1, 2, 3, 4);
}